

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

optional<real_token> *
read_real(optional<real_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2)

{
  undefined1 auVar1 [16];
  bool bVar2;
  byte bVar3;
  uint uVar4;
  double dVar5;
  undefined1 auVar6 [16];
  _Storage<double,_true> _Var7;
  undefined8 extraout_XMM0_Qb;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  optional<double> oVar8;
  
  __y._M_str = "-";
  __y._M_len = 1;
  bVar2 = std::operator==(buf_1,__y);
  if (bVar2) {
    oVar8 = read_real(buf_2);
    if (((undefined1  [16])
         oVar8.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      uVar4 = 1;
      dVar5 = -1.0;
    }
    else {
      auVar6._8_8_ = 0x8000000000000000;
      auVar6._0_8_ = 0x8000000000000000;
      auVar1._8_8_ = extraout_XMM0_Qb;
      auVar1._0_8_ = oVar8.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload;
      auVar6 = vxorpd_avx512vl(auVar1,auVar6);
      dVar5 = auVar6._0_8_;
      uVar4 = 2;
    }
  }
  else {
    __y_00._M_str = "+";
    __y_00._M_len = 1;
    bVar2 = std::operator==(buf_1,__y_00);
    if (bVar2) {
      oVar8 = read_real(buf_2);
      _Var7 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload;
      bVar3 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged;
      uVar4 = (bVar3 & 1) + 1;
    }
    else {
      oVar8 = read_real(buf_1);
      _Var7 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload;
      bVar3 = oVar8.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_engaged & 1;
      uVar4 = (uint)bVar3;
    }
    dVar5 = (double)((ulong)(bVar3 & 1) * (long)_Var7 +
                    (ulong)!(bool)(bVar3 & 1) * 0x3ff0000000000000);
  }
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_payload._M_value.value = dVar5;
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_payload._M_value.read = uVar4;
  (__return_storage_ptr__->super__Optional_base<real_token,_true,_true>)._M_payload.
  super__Optional_payload_base<real_token>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<real_token>
read_real(const std::string_view buf_1, const std::string_view buf_2) noexcept
{
    std::optional<double> value_opt;

    if (buf_1 == "-") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(-1.0, 1);
        else
            return real_token(-1.0 * *value_opt, 2);
    }

    if (buf_1 == "+") {
        value_opt = read_real(buf_2);
        if (!value_opt)
            return real_token(1.0, 1);
        else
            return real_token(*value_opt, 2);
    }

    value_opt = read_real(buf_1);
    if (!value_opt)
        return real_token(1.0, 0);

    return real_token(*value_opt, 1);
}